

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall arangodb::velocypack::Parser::parseObject(Parser *this)

{
  size_t value;
  AttributeTranslator *this_00;
  Builder *this_01;
  int iVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  uint64_t v;
  Exception *this_02;
  char *msg;
  int iVar4;
  string_view key_00;
  uint8_t *local_40;
  Slice key;
  
  Builder::addCompoundValue(this->_builderPtr,'\v');
  increaseNesting(this);
  iVar4 = 0x11764b;
  iVar1 = skipWhiteSpace(this,"Expecting item or \'}\'");
  if (iVar1 == 0x7d) {
    consume(this);
    if ((this->_nesting == 0) && (this->options->keepTopLevelOpen != false)) {
      return;
    }
    this->_nesting = this->_nesting - 1;
    Builder::close(this->_builderPtr,iVar4);
    return;
  }
  do {
    if (iVar1 != 0x22) {
      this_02 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Expecting \'\"\' or \'}\'";
LAB_0010e273:
      Exception::Exception(this_02,ParseError,msg);
      __cxa_throw(this_02,&Exception::typeinfo,Exception::~Exception);
    }
    this->_pos = this->_pos + 1;
    Builder::reportAdd(this->_builderPtr);
    value = this->_builderPtr->_pos;
    parseString(this);
    this_00 = this->options->attributeTranslator;
    if ((this_00 != (AttributeTranslator *)0x0) &&
       (puVar3 = this->_builderPtr->_start, key._start = puVar3 + value,
       (ulong)puVar3[value] - 0x40 < 0x80)) {
      key_00 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::stringView
                         ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                          &key);
      puVar3 = AttributeTranslator::translate(this_00,key_00);
      if (puVar3 != (uint8_t *)0x0) {
        Builder::resetTo(this->_builderPtr,value);
        this_01 = this->_builderPtr;
        local_40 = puVar3;
        v = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getUInt
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_40);
        Builder::addUInt(this_01,v);
      }
    }
    iVar1 = skipWhiteSpace(this,"Expecting \':\'");
    if (iVar1 != 0x3a) {
      this_02 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Expecting \':\'";
      goto LAB_0010e273;
    }
    this->_pos = this->_pos + 1;
    parseJson(this);
    iVar4 = 0x117684;
    iVar1 = skipWhiteSpace(this,"Expecting \',\' or \'}\'");
    if (iVar1 == 0x7d) {
      this->_pos = this->_pos + 1;
      if ((this->_nesting != 1) || (uVar2 = 0, this->options->keepTopLevelOpen == false)) {
        Builder::close(this->_builderPtr,iVar4);
        uVar2 = this->_nesting - 1;
      }
      this->_nesting = uVar2;
      return;
    }
    if (iVar1 != 0x2c) {
      this_02 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Expecting \',\' or \'}\'";
      goto LAB_0010e273;
    }
    this->_pos = this->_pos + 1;
    iVar1 = skipWhiteSpace(this,"Expecting \'\"\' or \'}\'");
  } while( true );
}

Assistant:

void Parser::parseObject() {
  _builderPtr->addObject();

  increaseNesting();
  int i = skipWhiteSpace("Expecting item or '}'");
  if (i == '}') {
    // empty object
    consume();  // the closing '}'. return value intentionally not checked

    if (_nesting != 0 || !options->keepTopLevelOpen) {
      // only close if we've not been asked to keep top level open
      decreaseNesting();
      _builderPtr->close();
    }
    return;
  }

  while (true) {
    // always expecting a string attribute name here
    if (VELOCYPACK_UNLIKELY(i != '"')) {
      throw Exception(Exception::ParseError, "Expecting '\"' or '}'");
    }
    // get past the initial '"'
    ++_pos;

    _builderPtr->reportAdd();
    auto const lastPos = _builderPtr->_pos;
    parseString();

    if (options->attributeTranslator != nullptr) {
      // check if a translation for the attribute name exists
      Slice key(_builderPtr->_start + lastPos);

      if (key.isString()) {
        uint8_t const* translated =
            options->attributeTranslator->translate(key.stringView());

        if (translated != nullptr) {
          // found translation... now reset position to old key position
          // and simply overwrite the existing key with the numeric translation
          // id
          _builderPtr->resetTo(lastPos);
          _builderPtr->addUInt(Slice(translated).getUInt());
        }
      }
    }

    i = skipWhiteSpace("Expecting ':'");
    // always expecting the ':' here
    if (VELOCYPACK_UNLIKELY(i != ':')) {
      throw Exception(Exception::ParseError, "Expecting ':'");
    }
    ++_pos;  // skip over the colon

    parseJson();

    i = skipWhiteSpace("Expecting ',' or '}'");
    if (i == '}') {
      // end of object
      ++_pos;  // the closing '}'
      if (_nesting != 1 || !options->keepTopLevelOpen) {
        // only close if we've not been asked to keep top level open
        _builderPtr->close();
      }
      decreaseNesting();
      return;
    }
    if (VELOCYPACK_UNLIKELY(i != ',')) {
      throw Exception(Exception::ParseError, "Expecting ',' or '}'");
    }
    // skip over ','
    ++_pos;  // the ','
    i = skipWhiteSpace("Expecting '\"' or '}'");
  }

  // should never get here
  VELOCYPACK_ASSERT(false);
}